

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O2

void __thiscall QtMWidgets::ToolButton::paintEvent(ToolButton *this,QPaintEvent *param_1)

{
  char cVar1;
  undefined8 uVar2;
  int h;
  undefined1 auVar3 [16];
  QPainter p;
  QPixmap pixmap;
  
  QAction::icon();
  cVar1 = QIcon::isNull();
  QIcon::~QIcon((QIcon *)&pixmap);
  if (cVar1 == '\0') {
    QAction::icon();
    QIcon::pixmap(&pixmap,&p,&((this->d).d)->iconSize,0,1);
    QIcon::~QIcon((QIcon *)&p);
    auVar3 = QWidget::contentsRect();
    uVar2 = QPixmap::size();
    QPainter::QPainter(&p,(QPaintDevice *)&this->field_0x10);
    h = (int)((ulong)uVar2 >> 0x20);
    QPainter::drawPixmap
              (&p,auVar3._0_4_ + (((auVar3._8_4_ - auVar3._0_4_) - (int)uVar2) + 1) / 2,
               auVar3._4_4_ + (((auVar3._12_4_ - auVar3._4_4_) - h) + 1) / 2,(int)uVar2,h,&pixmap);
    QPainter::~QPainter(&p);
    QPixmap::~QPixmap(&pixmap);
  }
  return;
}

Assistant:

void
ToolButton::paintEvent( QPaintEvent * )
{
	if( !d->action->icon().isNull() )
	{
		const QPixmap pixmap = d->action->icon().pixmap( d->iconSize );
		const QRect r = contentsRect();
		const QSize s = pixmap.size();

		QPainter p( this );

		p.drawPixmap( r.left() + ( r.width() - s.width() ) / 2,
			r.top() + ( r.height() - s.height() ) / 2,
			s.width(), s.height(), pixmap );
	}
}